

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O3

void IDASensPredict(IDAMem IDA_mem,N_Vector *yySens,N_Vector *ypSens)

{
  sunrealtype *psVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar7;
  
  auVar2 = _DAT_00134060;
  uVar4 = (ulong)(IDA_mem->ida_kk + 1);
  psVar1 = IDA_mem->ida_cvals;
  if (-1 < IDA_mem->ida_kk) {
    lVar7 = uVar4 - 1;
    auVar5._8_4_ = (int)lVar7;
    auVar5._0_8_ = lVar7;
    auVar5._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar3 = 0;
    auVar5 = auVar5 ^ _DAT_00134060;
    auVar6 = _DAT_00134050;
    do {
      auVar8 = auVar6 ^ auVar2;
      if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                  auVar5._4_4_ < auVar8._4_4_) & 1)) {
        *(undefined8 *)((long)psVar1 + uVar3) = 0x3ff0000000000000;
      }
      if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
          auVar8._12_4_ <= auVar5._12_4_) {
        *(undefined8 *)((long)psVar1 + uVar3 + 8) = 0x3ff0000000000000;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      uVar3 = uVar3 + 0x10;
    } while ((uVar4 * 8 + 8 & 0xfffffffffffffff0) != uVar3);
  }
  N_VLinearCombinationVectorArray(IDA_mem->ida_Ns,uVar4,psVar1,IDA_mem->ida_phiS,yySens);
  N_VLinearCombinationVectorArray
            (IDA_mem->ida_Ns,IDA_mem->ida_kk,IDA_mem->ida_gamma + 1,IDA_mem->ida_phiS + 1,ypSens);
  return;
}

Assistant:

static void IDASensPredict(IDAMem IDA_mem, N_Vector* yySens, N_Vector* ypSens)
{
  int j;

  for (j = 0; j <= IDA_mem->ida_kk; j++) { IDA_mem->ida_cvals[j] = ONE; }

  (void)N_VLinearCombinationVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_kk + 1,
                                        IDA_mem->ida_cvals, IDA_mem->ida_phiS,
                                        yySens);

  (void)N_VLinearCombinationVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_kk,
                                        IDA_mem->ida_gamma + 1,
                                        IDA_mem->ida_phiS + 1, ypSens);
}